

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

double __thiscall ON_3dVector::LengthAndUnitize(ON_3dVector *this)

{
  double y;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar3 = this->x;
  y = this->y;
  dVar5 = this->z;
  dVar1 = ON_Length3d(dVar3,y,dVar5);
  if (dVar1 <= 2.2250738585072014e-308) {
    if (dVar1 <= 0.0) {
      this->x = 0.0;
      this->y = 0.0;
      this->z = 0.0;
      dVar1 = 0.0;
    }
    else {
      dVar2 = ON_Length3d(dVar3 * 8.98846567431158e+307,y * 8.98846567431158e+307,
                          dVar5 * 8.98846567431158e+307);
      dVar4 = 1.0 / dVar2;
      if (2.2250738585072014e-308 < dVar2) {
        dVar5 = dVar5 * 8.98846567431158e+307 * dVar4;
      }
      else {
        dVar5 = 0.0;
      }
      dVar1 = (double)((ulong)dVar1 & -(ulong)(2.2250738585072014e-308 < dVar2));
      if (2.2250738585072014e-308 < dVar2) {
        dVar3 = dVar3 * 8.98846567431158e+307 * dVar4;
        dVar4 = y * 8.98846567431158e+307 * dVar4;
      }
      else {
        dVar3 = 0.0;
        dVar4 = 0.0;
      }
      this->x = dVar3;
      this->y = dVar4;
      this->z = dVar5;
    }
  }
  else {
    dVar2 = 1.0 / dVar1;
    this->x = dVar3 * dVar2;
    this->y = y * dVar2;
    this->z = dVar5 * dVar2;
  }
  return dVar1;
}

Assistant:

double ON_3dVector::LengthAndUnitize()
{
  double d;
  double len = Length();
  if ( len > ON_DBL_MIN )
  {
    d = 1.0/len;
    x *= d;
    y *= d;
    z *= d;
  }
  else if ( len > 0.0 && ON_IS_FINITE(len) )
  {
    // This code is rarely used and can be slow.
    // It multiplies by 2^1023 in an attempt to 
    // normalize the coordinates.
    // If the renormalization works, then we're
    // ok.  If the renormalization fails, we
    // return false.
    ON_3dVector tmp;
    tmp.x = x*8.9884656743115795386465259539451e+307;
    tmp.y = y*8.9884656743115795386465259539451e+307;
    tmp.z = z*8.9884656743115795386465259539451e+307;
    d = tmp.Length();
    if ( d > ON_DBL_MIN )
    {
      d = 1.0/d;
      x = tmp.x*d;
      y = tmp.y*d;
      z = tmp.z*d;
    }
    else
    {
      len = 0.0;
      x = 0.0;
      y = 0.0;
      z = 0.0;
    }
  }
  else
  {
    len = 0.0;
    x = 0.0;
    y = 0.0;
    z = 0.0;
  }

  return len;
}